

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintTo(space_info *value,iu_ostream *os)

{
  ostream *poVar1;
  UInt64 value_00;
  UInt64 value_01;
  UInt64 value_02;
  string sStack_78;
  string local_58;
  string local_38;
  
  poVar1 = std::operator<<(os,"cpacity: ");
  FormatSizeByte_abi_cxx11_(&local_38,(detail *)value->capacity,value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,", free: ");
  FormatSizeByte_abi_cxx11_(&local_58,(detail *)value->free,value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,", available: ");
  FormatSizeByte_abi_cxx11_(&sStack_78,(detail *)value->available,value_02);
  std::operator<<(poVar1,(string *)&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void PrintTo(const ::std::filesystem::space_info& value, iu_ostream* os)
{
    *os << "cpacity: " << detail::FormatSizeByte(value.capacity)
        << ", free: " << detail::FormatSizeByte(value.free)
        << ", available: " << detail::FormatSizeByte(value.available);
}